

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::addSemaphoreInfo(CLIntercept *this,cl_semaphore_khr semaphore,cl_context context)

{
  cl_platform_id p_Var1;
  mapped_type *pp_Var2;
  cl_semaphore_khr local_20;
  
  if (semaphore != (cl_semaphore_khr)0x0) {
    local_20 = semaphore;
    std::mutex::lock(&this->m_Mutex);
    p_Var1 = getPlatform(this,context);
    pp_Var2 = std::
              map<_cl_semaphore_khr_*,__cl_platform_id_*,_std::less<_cl_semaphore_khr_*>,_std::allocator<std::pair<_cl_semaphore_khr_*const,__cl_platform_id_*>_>_>
              ::operator[](&this->m_SemaphoreInfoMap,&local_20);
    *pp_Var2 = p_Var1;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  }
  return;
}

Assistant:

void CLIntercept::addSemaphoreInfo(
    cl_semaphore_khr semaphore,
    cl_context context )
{
    if( semaphore )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        m_SemaphoreInfoMap[semaphore] = getPlatform(context);
    }
}